

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O0

void __thiscall
CTcParser::finish_prop_expr
          (CTcParser *this,CTcPrsPropExprSave *save_info,CTcPrsNode **expr,CTPNCodeBody **cb,
          CTPNAnonFunc **inline_method,int is_static,int is_inline,CTcSymProp *prop_sym)

{
  int iVar1;
  void *pvVar2;
  CTcPrsSymtab *lcltab;
  CTPNCodeBody *pCVar3;
  undefined8 *in_RCX;
  long *in_RDX;
  byte *in_RSI;
  long in_RDI;
  CTcCodeBodyRef *in_R8;
  int in_R9D;
  int in_stack_00000008;
  CTcSymPropBase *in_stack_00000010;
  CTPNStm *stm;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff40;
  int is_method;
  undefined2 in_stack_ffffffffffffff44;
  tctarg_prop_id_t in_stack_ffffffffffffff46;
  CTcPrsNode *in_stack_ffffffffffffff48;
  CTPNCodeBody *pCVar5;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  CTcPrsSymtab *pCVar6;
  CTPNCodeBody *in_stack_ffffffffffffff68;
  CTcParser *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  CTPNCodeBody *in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffffb8;
  CTcSymLocal *in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffd0;
  
  *in_RCX = 0;
  in_R8->ptr = (CTPNCodeBody *)0x0;
  if ((*in_RDX != 0) &&
     (((*(byte *)(in_RDI + 0x1e8) & 1) != 0 || ((in_stack_00000008 != 0 && (in_R9D == 0)))))) {
    if (in_R9D == 0) {
      iVar1 = (**(code **)(*(long *)*in_RDX + 0x50))();
      if (iVar1 == 0) {
        in_stack_ffffffffffffff88 = (CTPNCodeBody *)CTcPrsAllocObj::operator_new(0x26c2a9);
        CTPNStmExpr::CTPNStmExpr
                  ((CTPNStmExpr *)
                   CONCAT26(in_stack_ffffffffffffff46,
                            CONCAT24(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40)),
                   (CTcPrsNode *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
        pCVar5 = in_stack_ffffffffffffff88;
      }
      else {
        pCVar5 = (CTPNCodeBody *)CTcPrsAllocObj::operator_new(0x26c248);
        CTPNStmReturn::CTPNStmReturn
                  ((CTPNStmReturn *)
                   CONCAT26(in_stack_ffffffffffffff46,
                            CONCAT24(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40)),
                   (CTcPrsNode *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      }
      iVar1 = (int)pCVar5;
    }
    else {
      pvVar2 = CTcPrsAllocObj::operator_new(0x26c1ac);
      iVar1 = (int)pvVar2;
      CTcSymPropBase::get_prop(in_stack_00000010);
      CTPNStmStaticPropInit::CTPNStmStaticPropInit
                ((CTPNStmStaticPropInit *)
                 CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                 in_stack_ffffffffffffff48,in_stack_ffffffffffffff46);
    }
    lcltab = (CTcPrsSymtab *)CTcPrsAllocObj::operator_new(0x26c309);
    in_stack_ffffffffffffff50 = *(undefined4 *)(in_RDI + 0x110);
    pCVar6 = *(CTcPrsSymtab **)(in_RSI + 0x30);
    pCVar5 = (CTPNCodeBody *)0x0;
    is_method = 0;
    uVar4 = 0;
    CTPNCodeBody::CTPNCodeBody
              (in_stack_ffffffffffffff88,lcltab,
               (CTcPrsSymtab *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
               (CTPNStm *)in_stack_ffffffffffffff70,(int)((ulong)in_stack_ffffffffffffff68 >> 0x20),
               (int)in_stack_ffffffffffffff68,(int)in_RDI,in_stack_ffffffffffffffb8,
               in_stack_ffffffffffffffc0,iVar1,in_stack_ffffffffffffffd0,in_R8);
    *in_RCX = lcltab;
    finish_local_ctx(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,pCVar6);
    CTPNCodeBodyBase::set_self_referenced((CTPNCodeBodyBase *)*in_RCX,*(int *)(in_RDI + 0x224));
    CTPNCodeBodyBase::set_full_method_ctx_referenced
              ((CTPNCodeBodyBase *)*in_RCX,*(int *)(in_RDI + 0x228));
    CTPNCodeBodyBase::set_local_ctx_needs_self((CTPNCodeBodyBase *)*in_RCX,*(int *)(in_RDI + 0x22c))
    ;
    CTPNCodeBodyBase::set_local_ctx_needs_full_method_ctx
              ((CTPNCodeBodyBase *)*in_RCX,*(int *)(in_RDI + 0x230));
    if ((in_stack_00000008 != 0) && (in_R9D == 0)) {
      CTPNCodeBodyBase::set_anon_method((CTPNCodeBodyBase *)*in_RCX,1);
      add_nested_stm((CTcParser *)
                     CONCAT26(in_stack_ffffffffffffff46,
                              CONCAT24(in_stack_ffffffffffffff44,is_method)),
                     (CTPNStmTop *)CONCAT44(in_stack_ffffffffffffff3c,uVar4));
      pCVar3 = (CTPNCodeBody *)CTcPrsAllocObj::operator_new(0x26c462);
      (**(code **)(*(long *)*in_RDX + 0x50))();
      CTPNAnonFunc::CTPNAnonFunc
                ((CTPNAnonFunc *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                 pCVar5,CONCAT22(in_stack_ffffffffffffff46,in_stack_ffffffffffffff44),is_method);
      in_R8->ptr = pCVar3;
      *in_RCX = 0;
    }
  }
  *(byte *)(in_RDI + 0x1e8) = *(byte *)(in_RDI + 0x1e8) & 0xfe | *in_RSI & 1;
  *(undefined4 *)(in_RDI + 0x1ec) = *(undefined4 *)(in_RSI + 4);
  *(undefined8 *)(in_RDI + 0x208) = *(undefined8 *)(in_RSI + 8);
  *(undefined4 *)(in_RDI + 0x210) = *(undefined4 *)(in_RSI + 0x10);
  *(undefined4 *)(in_RDI + 0x110) = *(undefined4 *)(in_RSI + 0x14);
  *(undefined4 *)(in_RDI + 0x114) = *(undefined4 *)(in_RSI + 0x18);
  *(undefined8 *)(in_RDI + 0x218) = *(undefined8 *)(in_RSI + 0x30);
  *(undefined4 *)(in_RDI + 0x220) = *(undefined4 *)(in_RSI + 0x20);
  *(undefined4 *)(in_RDI + 0x224) = *(undefined4 *)(in_RSI + 0x1c);
  *(undefined4 *)(in_RDI + 0x228) = *(undefined4 *)(in_RSI + 0x24);
  *(undefined4 *)(in_RDI + 0x22c) = *(undefined4 *)(in_RSI + 0x28);
  *(undefined4 *)(in_RDI + 0x230) = *(undefined4 *)(in_RSI + 0x2c);
  *(undefined8 *)(in_RDI + 0x118) = *(undefined8 *)(in_RSI + 0x38);
  *(undefined8 *)(in_RDI + 0x100) = *(undefined8 *)(in_RSI + 0x48);
  *(undefined8 *)(in_RDI + 0xf8) = *(undefined8 *)(in_RSI + 0x40);
  *(undefined8 *)(in_RDI + 0xf0) = *(undefined8 *)(in_RSI + 0x50);
  if ((in_stack_00000008 != 0) && (in_R9D == 0)) {
    CAnonFuncSymtabPrep::finish
              ((CAnonFuncSymtabPrep *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50))
    ;
  }
  return;
}

Assistant:

void CTcParser::finish_prop_expr(
    CTcPrsPropExprSave *save_info,
    CTcPrsNode* &expr, CTPNCodeBody* &cb, CTPNAnonFunc* &inline_method,
    int is_static, int is_inline, CTcSymProp *prop_sym)
{
    /* presume we won't need to create a code body or inline method */
    cb = 0;
    inline_method = 0;

    /* 
     *   If we have a local context, we have to set up a code body in order
     *   to initialize the local context at run-time.  If this is an inline
     *   object definition, and it's not a static property, we need to turn
     *   the expression into an anonymous method, so we also need to wrap it
     *   in a code body.
     */
    if (expr != 0
        && (has_local_ctx_
            || (is_inline && !is_static)))
    {
        /*   
         *   We need to wrap the expression in a code body to make the
         *   property into a method.  First, wrap the expression in an
         *   appropriate statement so that we can put it into a code body.
         */
        CTPNStm *stm;
        if (is_static)
        {
            /* 
             *   it's a static initializer - wrap it in a static initializer
             *   statement node 
             */
            stm = new CTPNStmStaticPropInit(expr, prop_sym->get_prop());
        }
        else if (expr->has_return_value())
        {
            /* normal property value - wrap it in a 'return' */
            stm = new CTPNStmReturn(expr);
        }
        else
        {
            /* 
             *   it's an expression that yields no value, such as a
             *   double-quoted string expression or a call to a void
             *   function; just use the expression itself 
             */
            stm = new CTPNStmExpr(expr);
        }
        
        /* wrap the expression statement in a code body */
        cb = new CTPNCodeBody(
            local_symtab_, goto_symtab_, stm, 0, 0, FALSE, FALSE, 0,
            local_cnt_, self_valid_, save_info->cur_code_body_);
        
        /* set up the local context for access to enclosing scope locals */
        finish_local_ctx(cb, local_symtab_);
        
        /* mark the code body for references to the method context */
        cb->set_self_referenced(self_referenced_);
        cb->set_full_method_ctx_referenced(full_method_ctx_referenced_);
        
        /* mark the code body for inclusion in any local context */
        cb->set_local_ctx_needs_self(local_ctx_needs_self_);
        cb->set_local_ctx_needs_full_method_ctx(
            local_ctx_needs_full_method_ctx_);
        
        /* 
         *   if this is a non-static property in an inline object
         *   definition, turn the expression into an anonymous method
         */
        if (is_inline && !is_static)
        {
            /* mark it as an anonymous method */
            cb->set_anon_method(TRUE);
            
            /* add the code body to the master list of nested functions */
            add_nested_stm(cb);
            
            /* wrap the code body in an anonymous method */
            inline_method = new CTPNAnonFunc(
                cb, expr->has_return_value(), TRUE);
            
            /* the anonymous method supersedes the code body */
            cb = 0;
        }
    }

    /* restore the saved parser state */
    has_local_ctx_ = save_info->has_local_ctx_;
    local_ctx_var_num_ = save_info->local_ctx_var_num_;
    ctx_var_props_used_ = save_info->ctx_var_props_used_;
    next_ctx_arr_idx_ = save_info->next_ctx_arr_idx_;
    local_cnt_ = save_info->local_cnt_;
    max_local_cnt_ = save_info->max_local_cnt_;
    cur_code_body_ = save_info->cur_code_body_;
    self_valid_ = save_info->self_valid_;
    self_referenced_ = save_info->self_referenced_;
    full_method_ctx_referenced_ = save_info->full_method_ctx_referenced_;
    local_ctx_needs_self_ = save_info->local_ctx_needs_self_;
    local_ctx_needs_full_method_ctx_ =
        save_info->local_ctx_needs_full_method_ctx_;
    enclosing_stm_ = save_info->enclosing_stm_;
    enclosing_local_symtab_ = save_info->enclosing_local_symtab_;
    local_symtab_ = save_info->local_symtab_;
    goto_symtab_ = save_info->goto_symtab_;

    /* 
     *   if this is a non-static property of an inline object, finish the
     *   anonymous method proxy symbol table for enclosing scopes 
     */
    if (is_inline && !is_static)
        save_info->inline_prep_.finish();
}